

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrlc.c
# Opt level: O0

void osqp_start_interrupt_listener(void)

{
  sigaction act;
  sigaction local_98;
  
  int_detected = 0;
  local_98.sa_flags = 0;
  sigemptyset(&local_98.sa_mask);
  local_98.__sigaction_handler.sa_handler = handle_ctrlc;
  sigaction(2,&local_98,(sigaction *)&oact);
  return;
}

Assistant:

void osqp_start_interrupt_listener(void) {
  struct sigaction act;

  int_detected = 0;
  act.sa_flags = 0;
  sigemptyset(&act.sa_mask);
  act.sa_handler = handle_ctrlc;
  sigaction(SIGINT, &act, &oact);
}